

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O3

void * resampler_create(void)

{
  undefined4 *puVar1;
  
  puVar1 = (undefined4 *)malloc(0x3c8);
  if (puVar1 != (undefined4 *)0x0) {
    *puVar1 = 0xf;
    *(undefined8 *)(puVar1 + 1) = 0;
    *(undefined8 *)(puVar1 + 3) = 0;
    *(undefined8 *)(puVar1 + 5) = 0;
    *(undefined8 *)(puVar1 + 7) = 0;
    *(undefined8 *)(puVar1 + 8) = 0;
    *(undefined8 *)(puVar1 + 10) = 0;
    *(undefined2 *)(puVar1 + 0xc) = 0xff05;
    *(undefined1 *)((long)puVar1 + 0x32) = 0xff;
    memset(puVar1 + 0xe,0,0x38c);
  }
  return puVar1;
}

Assistant:

void * resampler_create(void)
{
    resampler * r = ( resampler * ) malloc( sizeof(resampler) );
    if ( !r ) return 0;

    r->write_pos = SINC_WIDTH - 1;
    r->write_filled = 0;
    r->read_pos = 0;
    r->read_filled = 0;
    r->phase.quad = 0;
    r->phase_inc.quad = 0;
    r->inv_phase.quad = 0;
    r->inv_phase_inc.quad = 0;
    r->quality = RESAMPLER_QUALITY_MAX;
    r->delay_added = -1;
    r->delay_removed = -1;
    r->last_amp = 0;
    r->accumulator = 0;
    memset( r->buffer_in, 0, sizeof(r->buffer_in) );
    memset( r->buffer_out, 0, sizeof(r->buffer_out) );

    return r;
}